

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_storePC(sysbvm_bytecodeJit_t *jit,uint16_t pc)

{
  int32_t iVar1;
  uint8_t local_b [4];
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  uint16_t local_4;
  undefined1 local_2;
  undefined1 local_1;
  
  iVar1 = jit->pcOffset;
  local_b[0] = 'H';
  local_b[1] = 199;
  local_b[2] = 0x85;
  local_b[3] = (uint8_t)iVar1;
  local_7 = (undefined1)((uint)iVar1 >> 8);
  local_6 = (undefined1)((uint)iVar1 >> 0x10);
  local_5 = (undefined1)((uint)iVar1 >> 0x18);
  local_2 = (undefined1)((uint)(int)(short)pc >> 0xf);
  local_1 = local_2;
  local_4 = pc;
  sysbvm_bytecodeJit_addBytes(jit,0xb,local_b);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_storePC(sysbvm_bytecodeJit_t *jit, uint16_t pc)
{
    sysbvm_jit_x86_movImmediateI32IntoMemory64WithOffset(jit, SYSBVM_X86_RBP, jit->pcOffset, pc);
}